

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O1

void __thiscall xatlas::internal::segment::Atlas::growCharts(Atlas *this,float threshold)

{
  long lVar1;
  Chart *chart;
  bool bVar2;
  int iVar3;
  char *__function;
  uint uVar4;
  uint face;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  float fVar8;
  float local_40;
  
  if (this->m_facesLeft != 0) {
    uVar4 = 0xffffffff;
    uVar6 = 0;
    local_40 = 3.4028235e+38;
    uVar5 = 0xffffffff;
    do {
      while( true ) {
        fVar8 = local_40;
        uVar7 = (this->m_charts).m_base.size;
        face = (uint)uVar5;
        if (uVar7 <= uVar6) break;
        lVar1 = *(long *)((this->m_charts).m_base.buffer + (ulong)uVar6 * 8);
        iVar3 = *(int *)(lVar1 + 0xa4);
        if (iVar3 == 0) {
          fVar8 = 3.4028235e+38;
          uVar7 = 0xffffffff;
        }
        else {
          do {
            uVar7 = *(uint *)(*(long *)(lVar1 + 0x98) + 4 + (ulong)(iVar3 - 1) * 8);
            if ((this->m_faceCharts).m_base.size <= uVar7) {
              __function = "T &xatlas::internal::Array<int>::operator[](uint32_t) [T = int]";
              goto LAB_001b11ff;
            }
            fVar8 = *(float *)(*(long *)(lVar1 + 0x98) + (ulong)(iVar3 - 1) * 8);
            if (*(int *)((this->m_faceCharts).m_base.buffer + (ulong)uVar7 * 4) == -1) break;
            CostQueue::pop((CostQueue *)(lVar1 + 0x90));
            iVar3 = *(int *)(lVar1 + 0xa4);
            uVar7 = 0xffffffff;
          } while (iVar3 != 0);
        }
        if ((uVar7 != 0xffffffff) && (fVar8 < local_40)) {
          uVar5 = (ulong)uVar7;
          uVar4 = uVar6;
          local_40 = fVar8;
        }
        uVar6 = uVar6 + 1;
      }
      if (local_40 <= threshold && face != 0xffffffff) {
        if (uVar7 <= uVar4) {
          __function = 
          "T &xatlas::internal::Array<xatlas::internal::segment::Chart *>::operator[](uint32_t) [T = xatlas::internal::segment::Chart *]"
          ;
LAB_001b11ff:
          __assert_fail("index < m_base.size",
                        "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                        ,0x4ae,__function);
        }
        chart = *(Chart **)((this->m_charts).m_base.buffer + (ulong)uVar4 * 8);
        CostQueue::pop(&chart->candidates);
        bVar2 = addFaceToChart(this,chart,face);
        if (!bVar2) {
          if ((this->m_facePlanarRegionId).m_base.size <= face) {
            __function = 
            "T &xatlas::internal::Array<unsigned int>::operator[](uint32_t) [T = unsigned int]";
            goto LAB_001b11ff;
          }
          ArrayBase::push_back
                    (&(chart->failedPlanarRegions).m_base,
                     (this->m_facePlanarRegionId).m_base.buffer + uVar5 * 4);
        }
      }
      local_40 = 3.4028235e+38;
      uVar6 = 0;
      uVar4 = 0xffffffff;
      uVar5 = 0xffffffff;
    } while ((fVar8 <= threshold && face != 0xffffffff) && this->m_facesLeft != 0);
  }
  return;
}

Assistant:

void growCharts(float threshold)
	{
		XA_PROFILE_START(buildAtlasGrowCharts)
		for (;;) {
			if (m_facesLeft == 0)
				break;
			// Get the single best candidate out of the chart best candidates.
			uint32_t bestFace = UINT32_MAX, bestChart = UINT32_MAX;
			float lowestCost = FLT_MAX;
			for (uint32_t i = 0; i < m_charts.size(); i++) {
				Chart *chart = m_charts[i];
				// Get the best candidate from the chart.
				// Cleanup any best candidates that have been claimed by another chart.
				uint32_t face = UINT32_MAX;
				float cost = FLT_MAX;
				for (;;) {
					if (chart->candidates.count() == 0)
						break;
					cost = chart->candidates.peekCost();
					face = chart->candidates.peekFace();
					if (m_faceCharts[face] == -1)
						break;
					else {
						// Face belongs to another chart. Pop from queue so the next best candidate can be retrieved.
						chart->candidates.pop();
						face = UINT32_MAX;
					}
				}
				if (face == UINT32_MAX)
					continue; // No candidates for this chart.
				// See if best candidate overall.
				if (cost < lowestCost) {
					lowestCost = cost;
					bestFace = face;
					bestChart = i;
				}
			}
			if (bestFace == UINT32_MAX || lowestCost > threshold)
				break;
			Chart *chart = m_charts[bestChart];
			chart->candidates.pop(); // Pop the selected candidate from the queue.
			if (!addFaceToChart(chart, bestFace))
				chart->failedPlanarRegions.push_back(m_facePlanarRegionId[bestFace]);
		}
		XA_PROFILE_END(buildAtlasGrowCharts)
	}